

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

free_ptr<nn> scoped_calloc_or_throw<nn>(void)

{
  undefined8 *puVar1;
  nn *__s;
  long lVar2;
  _Head_base<0UL,_nn_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<nn> fVar3;
  
  __s = calloc_or_throw<nn>(1);
  memset(__s,0,0x13ad8);
  lVar2 = 0x30;
  do {
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values.end_array +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies.end_array + lVar2)
         = 0;
    lVar2 = lVar2 + 0x68;
  } while (lVar2 != 0x6830);
  lVar2 = 0x6900;
  do {
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values.end_array +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies.end_array + lVar2)
         = 0;
    lVar2 = lVar2 + 0x68;
  } while (lVar2 != 0xd100);
  lVar2 = 0xd1d0;
  do {
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values.end_array +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__s->output_layer).super_example_predict.feature_space[0].values._begin +
             lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(__s->output_layer).super_example_predict.feature_space + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&(__s->output_layer).super_example_predict.feature_space[0].indicies.end_array + lVar2)
         = 0;
    lVar2 = lVar2 + 0x68;
  } while (lVar2 != 0x139d0);
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl = destroy_free<nn>;
  *(nn **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) = __s;
  fVar3._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  fVar3._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<nn>)
         fVar3._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}